

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_template.hpp
# Opt level: O0

bool __thiscall
boost::detail::function::
basic_vtable2<boost::iterator_range<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
::assign_to<boost::algorithm::detail::token_finderF<boost::algorithm::detail::is_any_ofF<char>>>
          (basic_vtable2<boost::iterator_range<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,___gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *this,token_finderF<boost::algorithm::detail::is_any_ofF<char>_> *f,
          function_buffer *functor)

{
  bool bVar1;
  undefined8 in_RDX;
  token_finderF<boost::algorithm::detail::is_any_ofF<char>_> *in_RDI;
  token_finderF<boost::algorithm::detail::is_any_ofF<char>_> *in_stack_ffffffffffffff98;
  undefined1 local_38 [32];
  undefined8 local_18;
  
  local_18 = in_RDX;
  algorithm::detail::token_finderF<boost::algorithm::detail::is_any_ofF<char>_>::token_finderF
            (in_RDI,in_stack_ffffffffffffff98);
  bVar1 = assign_to<boost::algorithm::detail::token_finderF<boost::algorithm::detail::is_any_ofF<char>>>
                    ((basic_vtable2<boost::iterator_range<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,___gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_RDI,local_38,local_18);
  algorithm::detail::token_finderF<boost::algorithm::detail::is_any_ofF<char>_>::~token_finderF
            ((token_finderF<boost::algorithm::detail::is_any_ofF<char>_> *)0x2adad0);
  return bVar1;
}

Assistant:

bool assign_to(F f, function_buffer& functor) const
        {
          typedef typename get_function_tag<F>::type tag;
          return assign_to(f, functor, tag());
        }